

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_cmap12_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  if (valid->limit < table + 0x10) {
    ft_validator_error(valid,8);
  }
  uVar6 = *(uint *)(table + 4);
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  bVar1 = table[0xc];
  bVar2 = table[0xd];
  bVar3 = table[0xe];
  bVar4 = table[0xf];
  uVar7 = (ulong)bVar2 * 0x10000 + (ulong)bVar1 * 0x1000000 | (ulong)bVar3 * 0x100 | (ulong)bVar4;
  if (((uVar6 < 0x10) || ((ulong)((long)valid->limit - (long)table) < (ulong)uVar6)) ||
     (((ulong)uVar6 - 0x10) / 0xc < uVar7)) {
    ft_validator_error(valid,8);
  }
  if (uVar7 != 0) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      uVar5 = *(uint *)(table + 0x10 + lVar8);
      uVar9 = *(uint *)(table + lVar8 + 0x14);
      uVar10 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar5 = *(uint *)(table + lVar8 + 0x18);
      if (uVar9 < uVar10) {
        ft_validator_error(valid,8);
      }
      if ((lVar8 != 0) && (uVar10 <= uVar6)) {
        ft_validator_error(valid,8);
      }
      if ((valid->level != FT_VALIDATE_DEFAULT) &&
         ((uVar6 = (uint)valid[1].jump_buffer[0].__jmpbuf[0], uVar6 < uVar9 - uVar10 ||
          (uVar6 - (uVar9 - uVar10) <=
           (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18))))) {
        ft_validator_error(valid,0x10);
      }
      lVar8 = lVar8 + 0xc;
      uVar6 = uVar9;
    } while (((ulong)bVar3 * 0x100 + (ulong)bVar4 +
             (ulong)bVar1 * 0x1000000 + (ulong)bVar2 * 0x10000) * 0xc != lVar8);
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap12_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_groups;


    if ( table + 16 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 4;
    length = TT_NEXT_ULONG( p );

    p          = table + 12;
    num_groups = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 16 + 12 * num_groups ? */
         length < 16                                 ||
         ( length - 16 ) / 12 < num_groups           )
      FT_INVALID_TOO_SHORT;

    /* check groups, they must be in increasing order */
    {
      FT_ULong  n, start, end, start_id, last = 0;


      for ( n = 0; n < num_groups; n++ )
      {
        start    = TT_NEXT_ULONG( p );
        end      = TT_NEXT_ULONG( p );
        start_id = TT_NEXT_ULONG( p );

        if ( start > end )
          FT_INVALID_DATA;

        if ( n > 0 && start <= last )
          FT_INVALID_DATA;

        if ( valid->level >= FT_VALIDATE_TIGHT )
        {
          FT_UInt32  d = end - start;


          /* start_id + end - start >= TT_VALID_GLYPH_COUNT( valid ) ? */
          if ( d > TT_VALID_GLYPH_COUNT( valid )             ||
               start_id >= TT_VALID_GLYPH_COUNT( valid ) - d )
            FT_INVALID_GLYPH_ID;
        }

        last = end;
      }
    }

    return FT_Err_Ok;
  }